

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Patch
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l,SizeType s)

{
  SizeType SVar1;
  State *pSVar2;
  
  while (l != 0xffffffff) {
    pSVar2 = GetState(this,l);
    SVar1 = pSVar2->out;
    pSVar2 = GetState(this,l);
    pSVar2->out = s;
    l = SVar1;
  }
  return;
}

Assistant:

void Patch(SizeType l, SizeType s) {
        for (SizeType next; l != kRegexInvalidState; l = next) {
            next = GetState(l).out;
            GetState(l).out = s;
        }
    }